

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

char * __thiscall HV_Edit_Buffer::add(HV_Edit_Buffer *this,char *text,int size)

{
  size_t sVar1;
  long lVar2;
  
  if (size < 0) {
    sVar1 = strlen(text);
    size = (int)sVar1;
  }
  if (size != 0) {
    check(this,size);
    sVar1 = (size_t)size;
    memcpy(this->buf_ + this->size_,text,sVar1);
    lVar2 = (long)this->size_ + sVar1;
    this->size_ = (int)lVar2;
    this->buf_[lVar2] = '\0';
    text = text + sVar1;
  }
  return text;
}

Assistant:

const char *HV_Edit_Buffer::add(const char *text, int size) {

  if (size < 0) size = (int)strlen(text);
  if (!size) return text;

  check(size);

#if (DEBUG_EDIT_BUFFER > 1)
  printf("HV_Edit_Buffer::add(text,%d), allocated=%d, size=%d\n",
	 size, allocated_, size_+size);
  fflush(stdout);
#endif

  memcpy(buf_+size_, text, size);
  size_ += size;
  buf_[size_] = '\0';

  return (text + size);

}